

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArrayStrideContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  Node *pNVar2;
  TestNode *pTVar3;
  LayoutQualifier *this;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr layout;
  Layout local_44;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,4);
  pNVar2 = parentStructure->m_ptr;
  NVar1 = pNVar2->m_type;
  if ((NVar1 == TYPE_INTERFACE_BLOCK) &&
     ((*(char *)&pNVar2[1]._vptr_Node != '\x01' ||
      (((pNVar2->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)))) {
    generateVariableCases(context,parentStructure,targetGroup,&queryTarget,1,true);
    generateVariableArrayCases(context,parentStructure,targetGroup,&queryTarget,1);
    generateCompoundVariableCases(context,parentStructure,targetGroup,&queryTarget,1);
  }
  else {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar3,&queryTarget,2,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar3,&queryTarget,2,false);
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    if (NVar1 != TYPE_INTERFACE_BLOCK) {
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,
                 TYPE_SAMPLER_2D,1,false);
      this = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout(&local_44,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(this,parentStructure,&local_44);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)this);
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,&layout,(TestCaseGroup *)pTVar3,queryTarget.interface,
                 TYPE_UINT_ATOMIC_COUNTER,1,false);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&layout);
    }
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,TYPE_FLOAT,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,TYPE_BOOL,1,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,TYPE_BOOL_VEC3,
               2,false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,TYPE_FLOAT_VEC3
               ,2,false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,queryTarget.interface,TYPE_INT_VEC3,2
               ,false);
  }
  return;
}

Assistant:

static void generateUniformBlockArrayStrideContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_STRIDE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .sampler_2d_*
			if (!isInterfaceBlock)
				generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_SAMPLER_2D, 1, false);

			// .atomic_counter_*
			if (!isInterfaceBlock)
			{
				const ResourceDefinition::Node::SharedPtr layout(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
				generateBufferBackedArrayStrideTypeAggregateCases(context, layout, blockGroup, queryTarget.interface, glu::TYPE_UINT_ATOMIC_COUNTER, 1, false);
			}

			// .float_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT, 2, false);

			// .bool_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL, 1, false);

			// .bvec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, 2, false);

			// .vec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC3, 2, false);

			// .ivec2_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_INT_VEC3, 2, false);
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}